

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O1

int run_test_fs_event_watch_dir(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  undefined8 uVar2;
  int iVar3;
  int extraout_EDX;
  int extraout_EDX_00;
  char *pcVar4;
  uint uVar5;
  char *pcVar6;
  long *plVar7;
  uv_fs_event_t *puVar8;
  code **ppcVar9;
  int64_t eval_b;
  int64_t eval_a;
  code *apcStack_460 [2];
  char acStack_450 [8];
  uv_fs_event_t auStack_448 [4];
  undefined8 uStack_280;
  long lStack_268;
  char *pcStack_260;
  char acStack_210 [440];
  code *pcStack_58;
  undefined8 uStack_48;
  long lStack_40;
  undefined8 uStack_38;
  long local_10;
  
  uVar2 = uv_default_loop();
  fs_event_unlink_files((uv_timer_t *)0x0);
  remove("watch_dir/file2");
  remove("watch_dir/file1");
  remove("watch_dir/");
  create_dir("watch_dir");
  iVar1 = uv_fs_event_init(uVar2,&fs_event);
  local_10 = (long)iVar1;
  if (local_10 == 0) {
    iVar1 = uv_fs_event_start(&fs_event,fs_event_cb_dir_multi_file,"watch_dir",0);
    local_10 = (long)iVar1;
    if (local_10 != 0) goto LAB_0018792b;
    iVar1 = uv_timer_init(uVar2,&timer);
    local_10 = (long)iVar1;
    if (local_10 != 0) goto LAB_00187938;
    iVar1 = uv_timer_start(&timer,fs_event_create_files,100,0);
    local_10 = (long)iVar1;
    if (local_10 != 0) goto LAB_00187945;
    uv_run(uVar2,0);
    local_10 = (long)fs_event_cb_called;
    if (local_10 != (long)fs_event_removed + (long)fs_event_created) goto LAB_00187952;
    local_10 = 2;
    if (close_cb_called != 2) goto LAB_0018795f;
    fs_event_unlink_files((uv_timer_t *)0x0);
    remove("watch_dir/file2");
    remove("watch_dir/file1");
    remove("watch_dir/");
    uv_walk(uVar2,close_walk_cb,0);
    uv_run(uVar2,0);
    local_10 = 0;
    iVar1 = uv_loop_close(uVar2);
    if (local_10 == iVar1) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_fs_event_watch_dir_cold_1();
LAB_0018792b:
    run_test_fs_event_watch_dir_cold_2();
LAB_00187938:
    run_test_fs_event_watch_dir_cold_3();
LAB_00187945:
    run_test_fs_event_watch_dir_cold_4();
LAB_00187952:
    run_test_fs_event_watch_dir_cold_5();
LAB_0018795f:
    run_test_fs_event_watch_dir_cold_6();
  }
  plVar7 = &local_10;
  run_test_fs_event_watch_dir_cold_7();
  uStack_38 = uVar2;
  if (plVar7 == (long *)0x0) {
LAB_00187a5a:
    uVar5 = 0;
    do {
      pcStack_58 = (code *)0x187a89;
      snprintf(fs_event_filename,0x1000,"watch_dir/%s%d","fsevent-",(ulong)uVar5);
      pcStack_58 = (code *)0x187a91;
      iVar1 = remove(fs_event_filename);
      uVar5 = uVar5 + 1;
    } while (uVar5 != 0x10);
    return iVar1;
  }
  lStack_40 = (long)fs_event_removed;
  uStack_48 = 0x10;
  if (lStack_40 < 0x10) {
    pcStack_58 = (code *)0x1879d5;
    snprintf(fs_event_filename,0x1000,"watch_dir/%s%d","fsevent-");
    pcStack_58 = (code *)0x1879dd;
    iVar1 = remove(fs_event_filename);
    lStack_40 = (long)iVar1;
    uStack_48 = 0;
    if (lStack_40 == 0) {
      if (0xe < fs_event_removed) {
        iVar1 = fs_event_removed;
        fs_event_removed = fs_event_removed + 1;
        return iVar1;
      }
      pcStack_58 = (code *)0x187a2f;
      fs_event_removed = fs_event_removed + 1;
      iVar1 = uv_timer_start(&timer,fs_event_unlink_files,1,0);
      lStack_40 = (long)iVar1;
      uStack_48 = 0;
      if (lStack_40 == 0) {
        return iVar1;
      }
      pcStack_58 = (code *)0x187a5a;
      fs_event_unlink_files_cold_3();
      goto LAB_00187a5a;
    }
  }
  else {
    pcStack_58 = (code *)0x187ab2;
    fs_event_unlink_files_cold_1();
  }
  plVar7 = &lStack_40;
  pcStack_58 = create_dir;
  fs_event_unlink_files_cold_2();
  pcVar6 = acStack_210;
  puVar8 = (uv_fs_event_t *)0x0;
  iVar3 = 0x1ed;
  iVar1 = uv_fs_mkdir(0,pcVar6,plVar7,0x1ed,0);
  if ((iVar1 == -0x11) || (iVar1 == 0)) {
    iVar1 = uv_fs_req_cleanup(acStack_210);
    return iVar1;
  }
  create_dir_cold_1();
  uVar5 = fs_event_cb_called + 1;
  pcVar4 = (char *)(ulong)uVar5;
  fs_event_cb_called = uVar5;
  if (puVar8 == &fs_event) {
    if (iVar3 != 0) goto LAB_00187c0d;
    if (1 < extraout_EDX - 1U) goto LAB_00187c1a;
    iVar1 = strncmp(pcVar6,"fsevent-",8);
    if (iVar1 == 0) {
      iVar1 = fs_event_removed + fs_event_created;
      if (iVar1 == 0x10) {
        iVar1 = uv_timer_start(&timer,fs_event_unlink_files,1,0);
        if (iVar1 == 0) {
          return 0;
        }
        fs_event_cb_dir_multi_file_cold_5();
        iVar1 = extraout_EAX;
      }
      if (uVar5 != 0x20) {
        return iVar1;
      }
      uv_close(&timer,close_cb);
      iVar1 = uv_close(&fs_event,close_cb);
      return iVar1;
    }
  }
  else {
    fs_event_cb_dir_multi_file_cold_1();
LAB_00187c0d:
    fs_event_cb_dir_multi_file_cold_2();
LAB_00187c1a:
    fs_event_cb_dir_multi_file_cold_3();
  }
  fs_event_cb_dir_multi_file_cold_4();
  if (fs_event_created < 0x10) {
    pcVar4 = fs_event_filename;
    snprintf(fs_event_filename,0x1000,"watch_dir/%s%d","fsevent-");
    create_file(fs_event_filename);
    iVar1 = fs_event_created;
    if (0xe < fs_event_created) {
      fs_event_created = fs_event_created + 1;
      return iVar1;
    }
    fs_event_created = fs_event_created + 1;
    iVar1 = uv_timer_start(&timer,fs_event_create_files,100,0);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    fs_event_create_files_cold_1();
  }
  fs_event_create_files_cold_2();
  pcStack_260 = pcVar4;
  uVar2 = uv_default_loop();
  remove("watch_dir/file2");
  remove("watch_dir/file1");
  remove("watch_dir/");
  create_dir("watch_dir");
  create_file("watch_dir/file1");
  create_file("watch_dir/file2");
  iVar1 = uv_fs_event_init(uVar2,&fs_event);
  lStack_268 = (long)iVar1;
  if (lStack_268 == 0) {
    iVar1 = uv_fs_event_start(&fs_event,fs_event_cb_file,"watch_dir/file2",0);
    lStack_268 = (long)iVar1;
    if (lStack_268 != 0) goto LAB_00187efc;
    iVar1 = uv_timer_init(uVar2,&timer);
    lStack_268 = (long)iVar1;
    if (lStack_268 != 0) goto LAB_00187f09;
    iVar1 = uv_timer_start(&timer,timer_cb_file,100,100);
    lStack_268 = (long)iVar1;
    if (lStack_268 != 0) goto LAB_00187f16;
    uv_run(uVar2,0);
    lStack_268 = 1;
    if (fs_event_cb_called != 1) goto LAB_00187f23;
    lStack_268 = 2;
    if (timer_cb_called != 2) goto LAB_00187f30;
    lStack_268 = 2;
    if (close_cb_called != 2) goto LAB_00187f3d;
    remove("watch_dir/file2");
    remove("watch_dir/file1");
    remove("watch_dir/");
    uv_walk(uVar2,close_walk_cb,0);
    uv_run(uVar2,0);
    lStack_268 = 0;
    iVar1 = uv_loop_close(uVar2);
    if (lStack_268 == iVar1) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_fs_event_watch_file_cold_1();
LAB_00187efc:
    run_test_fs_event_watch_file_cold_2();
LAB_00187f09:
    run_test_fs_event_watch_file_cold_3();
LAB_00187f16:
    run_test_fs_event_watch_file_cold_4();
LAB_00187f23:
    run_test_fs_event_watch_file_cold_5();
LAB_00187f30:
    run_test_fs_event_watch_file_cold_6();
LAB_00187f3d:
    run_test_fs_event_watch_file_cold_7();
  }
  plVar7 = &lStack_268;
  run_test_fs_event_watch_file_cold_8();
  iVar3 = 0x41;
  apcStack_460[0] = (code *)0x187f7d;
  uStack_280 = uVar2;
  iVar1 = uv_fs_open(0,&auStack_448[0].loop,plVar7,0x41,0x180,0);
  auStack_448[0].data = (void *)(long)iVar1;
  acStack_450[0] = '\0';
  acStack_450[1] = '\0';
  acStack_450[2] = '\0';
  acStack_450[3] = '\0';
  acStack_450[4] = '\0';
  acStack_450[5] = '\0';
  acStack_450[6] = '\0';
  acStack_450[7] = '\0';
  if (auStack_448[0].data == (void *)0x0) {
    apcStack_460[0] = (code *)0x187fa9;
    uv_fs_req_cleanup(&auStack_448[0].loop);
    iVar3 = 0;
    apcStack_460[0] = (code *)0x187fb7;
    iVar1 = uv_fs_close(0,&auStack_448[0].loop,auStack_448[0].wd);
    auStack_448[0].data = (void *)(long)iVar1;
    acStack_450[0] = '\0';
    acStack_450[1] = '\0';
    acStack_450[2] = '\0';
    acStack_450[3] = '\0';
    acStack_450[4] = '\0';
    acStack_450[5] = '\0';
    acStack_450[6] = '\0';
    acStack_450[7] = '\0';
    if (auStack_448[0].data == (void *)0x0) {
      apcStack_460[0] = (code *)0x187fdd;
      iVar1 = uv_fs_req_cleanup(&auStack_448[0].loop);
      return iVar1;
    }
  }
  else {
    apcStack_460[0] = (code *)0x187ff6;
    create_file_cold_1();
  }
  puVar8 = auStack_448;
  pcVar6 = acStack_450;
  apcStack_460[0] = fs_event_cb_file;
  create_file_cold_2();
  fs_event_cb_called = fs_event_cb_called + 1;
  if (puVar8 == &fs_event) {
    apcStack_460[0] = (code *)(long)iVar3;
    if (apcStack_460[0] != (code *)0x0) goto LAB_001880d3;
    apcStack_460[0] = (code *)(long)extraout_EDX_00;
    if (apcStack_460[0] != (code *)0x2) goto LAB_001880e2;
    iVar1 = strcmp(pcVar6,"file2");
    apcStack_460[0] = (code *)(long)iVar1;
    if (apcStack_460[0] == (code *)0x0) {
      iVar1 = uv_fs_event_stop(&fs_event);
      apcStack_460[0] = (code *)(long)iVar1;
      if (apcStack_460[0] == (code *)0x0) {
        iVar1 = uv_close(&fs_event,close_cb);
        return iVar1;
      }
      goto LAB_00188100;
    }
  }
  else {
    fs_event_cb_file_cold_1();
LAB_001880d3:
    fs_event_cb_file_cold_2();
LAB_001880e2:
    fs_event_cb_file_cold_3();
  }
  fs_event_cb_file_cold_4();
LAB_00188100:
  ppcVar9 = apcStack_460;
  fs_event_cb_file_cold_5();
  if (timer_cb_called == 0) {
    timer_cb_called = timer_cb_called + 1;
    touch_file("watch_dir/file1");
    return extraout_EAX_00;
  }
  timer_cb_called = timer_cb_called + 1;
  touch_file("watch_dir/file2");
  iVar1 = uv_close(ppcVar9,close_cb);
  return iVar1;
}

Assistant:

TEST_IMPL(fs_event_watch_dir) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#elif defined(__MVS__)
  RETURN_SKIP("Directory watching not supported on this platform.");
#elif defined(__APPLE__) && defined(__TSAN__)
  RETURN_SKIP("Times out under TSAN.");
#endif

  uv_loop_t* loop = uv_default_loop();
  int r;

  /* Setup */
  fs_event_unlink_files(NULL);
  remove("watch_dir/file2");
  remove("watch_dir/file1");
  remove("watch_dir/");
  create_dir("watch_dir");

  r = uv_fs_event_init(loop, &fs_event);
  ASSERT_OK(r);
  r = uv_fs_event_start(&fs_event, fs_event_cb_dir_multi_file, "watch_dir", 0);
  ASSERT_OK(r);
  r = uv_timer_init(loop, &timer);
  ASSERT_OK(r);
  r = uv_timer_start(&timer, fs_event_create_files, 100, 0);
  ASSERT_OK(r);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT_EQ(fs_event_cb_called, fs_event_created + fs_event_removed);
  ASSERT_EQ(2, close_cb_called);

  /* Cleanup */
  fs_event_unlink_files(NULL);
  remove("watch_dir/file2");
  remove("watch_dir/file1");
  remove("watch_dir/");

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}